

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O3

lua_State * getthread(lua_State *L,int *arg)

{
  int iVar1;
  lua_State *plVar2;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == 8) {
    *arg = 1;
    plVar2 = lua_tothread(L,1);
    return plVar2;
  }
  *arg = 0;
  return L;
}

Assistant:

static lua_State *getthread(lua_State *L, int *arg) {
    if (lua_isthread(L, 1)) {
        *arg = 1;
        return lua_tothread(L, 1);
    } else {
        *arg = 0;
        return L;  /* function will operate over current thread */
    }
}